

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TFunction * __thiscall
glslang::TParseContext::findFunction
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *pTVar1;
  TFunction *pTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar7;
  undefined4 extraout_var_00;
  TSymbol *pTVar8;
  undefined4 extraout_var_01;
  TFunction *local_110;
  byte local_101;
  TFunction *local_100;
  TFunction *local_f8;
  byte local_e9;
  bool needfindFunction400;
  bool explicitTypesEnabled;
  TString local_a0;
  TSymbol *local_78;
  TSymbol *symbol_1;
  TString local_68;
  TSymbol *local_40;
  TSymbol *symbol;
  TFunction *function;
  bool *builtIn_local;
  TFunction *call_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  function = (TFunction *)builtIn;
  builtIn_local = (bool *)call;
  call_local = (TFunction *)loc;
  loc_local = (TSourceLoc *)this;
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[3])();
  bVar3 = TSymbolTable::isFunctionNameVariable(pTVar1,(TString *)CONCAT44(extraout_var,iVar4));
  pTVar2 = call_local;
  if (bVar3) {
    pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*(long *)builtIn_local + 0x18))();
    pcVar6 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (pbVar7);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"can\'t use function syntax on variable",pcVar6,"");
    this_local = (TParseContext *)0x0;
  }
  else {
    symbol = (TSymbol *)0x0;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*(long *)builtIn_local + 0x18))();
    bVar3 = std::operator==(pbVar7,"debugPrintfEXT");
    if (bVar3) {
      pTVar1 = (this->super_TParseContextBase).symbolTable;
      pool_allocator<char>::pool_allocator((pool_allocator<char> *)&symbol_1);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_68,"debugPrintfEXT(",(pool_allocator<char> *)&symbol_1);
      pTVar8 = TSymbolTable::find(pTVar1,&local_68,(bool *)function,(bool *)0x0,(int *)0x0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_68);
      if (pTVar8 != (TSymbol *)0x0) {
        local_40 = pTVar8;
        iVar4 = (*pTVar8->_vptr_TSymbol[7])();
        return (TFunction *)CONCAT44(extraout_var_00,iVar4);
      }
      local_40 = (TSymbol *)0x0;
    }
    pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             (**(code **)(*(long *)builtIn_local + 0x18))();
    bVar3 = std::operator==(pbVar7,"coopMatPerElementNV");
    if (bVar3) {
      pTVar1 = (this->super_TParseContextBase).symbolTable;
      pool_allocator<char>::pool_allocator((pool_allocator<char> *)&stack0xffffffffffffff58);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_a0,"coopMatPerElementNV(",(pool_allocator<char> *)&stack0xffffffffffffff58);
      pTVar8 = TSymbolTable::find(pTVar1,&local_a0,(bool *)function,(bool *)0x0,(int *)0x0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_a0);
      if (pTVar8 != (TSymbol *)0x0) {
        local_78 = pTVar8;
        iVar4 = (*pTVar8->_vptr_TSymbol[7])();
        return (TFunction *)CONCAT44(extraout_var_01,iVar4);
      }
      local_78 = (TSymbol *)0x0;
    }
    uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_EXT_shader_explicit_arithmetic_types");
    local_e9 = 1;
    if ((uVar5 & 1) == 0) {
      uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_shader_explicit_arithmetic_types_int8");
      local_e9 = 1;
      if ((uVar5 & 1) == 0) {
        uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_explicit_arithmetic_types_int16");
        local_e9 = 1;
        if ((uVar5 & 1) == 0) {
          uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                            (this,"GL_EXT_shader_explicit_arithmetic_types_int32");
          local_e9 = 1;
          if ((uVar5 & 1) == 0) {
            uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                              (this,"GL_EXT_shader_explicit_arithmetic_types_int64");
            local_e9 = 1;
            if ((uVar5 & 1) == 0) {
              uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_shader_explicit_arithmetic_types_float16");
              local_e9 = 1;
              if ((uVar5 & 1) == 0) {
                uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                          [8])(this,"GL_EXT_shader_explicit_arithmetic_types_float32");
                local_e9 = 1;
                if ((uVar5 & 1) == 0) {
                  iVar4 = (*(this->super_TParseContextBase).super_TParseVersions.
                            _vptr_TParseVersions[8])
                                    (this,"GL_EXT_shader_explicit_arithmetic_types_float64");
                  local_e9 = (byte)iVar4;
                }
              }
            }
          }
        }
      }
    }
    bVar3 = TParseVersions::isEsProfile((TParseVersions *)this);
    if (bVar3) {
      if (((local_e9 & 1) == 0) ||
         ((this->super_TParseContextBase).super_TParseVersions.version < 0x136)) {
        uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_EXT_shader_implicit_conversions");
        if (((uVar5 & 1) == 0) ||
           ((this->super_TParseContextBase).super_TParseVersions.version < 0x136)) {
          local_100 = findFunctionExact(this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,
                                        (bool *)function);
        }
        else {
          local_100 = findFunction120(this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,
                                      (bool *)function);
        }
        local_f8 = local_100;
      }
      else {
        local_f8 = findFunctionExplicitTypes
                             (this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,
                              (bool *)function);
      }
      symbol = &local_f8->super_TSymbol;
    }
    else if ((this->super_TParseContextBase).super_TParseVersions.version < 0x78) {
      symbol = &findFunctionExact(this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,
                                  (bool *)function)->super_TSymbol;
    }
    else if ((this->super_TParseContextBase).super_TParseVersions.version < 400) {
      uVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_ARB_gpu_shader_fp64");
      local_101 = 1;
      if ((uVar5 & 1) == 0) {
        iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_ARB_gpu_shader5");
        local_101 = (byte)iVar4;
      }
      if ((local_101 & 1) == 0) {
        local_110 = findFunction120(this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,
                                    (bool *)function);
      }
      else {
        local_110 = findFunction400(this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,
                                    (bool *)function);
      }
      symbol = &local_110->super_TSymbol;
    }
    else if ((local_e9 & 1) == 0) {
      symbol = &findFunction400(this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,
                                (bool *)function)->super_TSymbol;
    }
    else {
      symbol = &findFunctionExplicitTypes
                          (this,(TSourceLoc *)call_local,(TFunction *)builtIn_local,(bool *)function
                          )->super_TSymbol;
    }
    this_local = (TParseContext *)symbol;
  }
  return (TFunction *)this_local;
}

Assistant:

const TFunction* TParseContext::findFunction(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    if (symbolTable.isFunctionNameVariable(call.getName())) {
        error(loc, "can't use function syntax on variable", call.getName().c_str(), "");
        return nullptr;
    }

    const TFunction* function = nullptr;

    // debugPrintfEXT has var args and is in the symbol table as "debugPrintfEXT()",
    // mangled to "debugPrintfEXT("
    if (call.getName() == "debugPrintfEXT") {
        TSymbol* symbol = symbolTable.find("debugPrintfEXT(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    // coopMatPerElementNV is variadic. There is some function signature error
    // checking in handleCoopMat2FunctionCall.
    if (call.getName() == "coopMatPerElementNV") {
        TSymbol* symbol = symbolTable.find("coopMatPerElementNV(", &builtIn);
        if (symbol)
            return symbol->getAsFunction();
    }

    bool explicitTypesEnabled = extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int8) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int16) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int32) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_int64) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float16) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float32) ||
                                extensionTurnedOn(E_GL_EXT_shader_explicit_arithmetic_types_float64);

    if (isEsProfile())
        function = (explicitTypesEnabled && version >= 310)
                   ? findFunctionExplicitTypes(loc, call, builtIn)
                   : ((extensionTurnedOn(E_GL_EXT_shader_implicit_conversions) && version >= 310)
                      ? findFunction120(loc, call, builtIn)
                      : findFunctionExact(loc, call, builtIn));
    else if (version < 120)
        function = findFunctionExact(loc, call, builtIn);
    else if (version < 400) {
        bool needfindFunction400 = extensionTurnedOn(E_GL_ARB_gpu_shader_fp64) || extensionTurnedOn(E_GL_ARB_gpu_shader5);
        function = needfindFunction400 ? findFunction400(loc, call, builtIn) : findFunction120(loc, call, builtIn);
    }
    else if (explicitTypesEnabled)
        function = findFunctionExplicitTypes(loc, call, builtIn);
    else
        function = findFunction400(loc, call, builtIn);

    return function;
}